

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O3

uint8_t nes_system_read_ppu_byte(nes_system *system,uint16_t address)

{
  nes_cartridge *pnVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint uVar4;
  undefined6 in_register_00000032;
  
  uVar4 = (uint)CONCAT62(in_register_00000032,address);
  if (uVar4 < 0x2000) {
    pnVar1 = system->cartridge;
    if ((ulong)address < pnVar1->chr_rom_size) {
      uVar2 = (*pnVar1->mapper->read_chr)(pnVar1,address);
      return uVar2;
    }
    uVar2 = (system->state).chr_ram[address];
  }
  else if (address < 0x3f00) {
    uVar4 = uVar4 - 0x2000;
    uVar3 = (ushort)uVar4;
    if ((uVar4 & 0xffff) < 0x1000) {
      uVar3 = (*system->cartridge->mapper->get_nametable_address)(system->cartridge,uVar3);
    }
    uVar2 = (system->state).vram[uVar3];
  }
  else if (address < 0x4000) {
    uVar4 = 0x1f;
    if ((address & 0x13) == 0x10) {
      uVar4 = 0xc;
    }
    uVar2 = (system->state).ppu.palettes[uVar4 & address];
  }
  else {
    uVar2 = '\0';
  }
  return uVar2;
}

Assistant:

static uint8_t nes_system_read_ppu_byte(nes_system* system, uint16_t address)
{ 
    if (address < 0x2000)
    {
        if (system->cartridge->chr_rom_size > address)
        {
            return system->cartridge->mapper->read_chr(system->cartridge, address);
        }
        else
        {
            return system->state.chr_ram[address];
        }
    }
    else
    {
        if (address < 0x3F00)
        {
            address = get_ppu_nametable_address(system, address);
            return system->state.vram[address];
        }
        else if (address <= 0x3FFF)
        {
            uint8_t palette_index = address & 0x1F;
            if ((palette_index & 0x13) == 0x10)
                palette_index &= ~0x10;

            return system->state.ppu.palettes[palette_index];
        }
    }

    return 0; 
}